

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::FreezeImpl
          (NullTypeHandlerBase *this,DynamicObject *instance,bool isConvertedType)

{
  BOOL BVar1;
  DictionaryTypeHandler *this_00;
  bool isConvertedType_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  this_00 = ConvertToDictionaryType(this,instance);
  BVar1 = DynamicTypeHandler::Freeze(&this_00->super_DynamicTypeHandler,instance,true);
  return BVar1;
}

Assistant:

BOOL NullTypeHandlerBase::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        return ConvertToDictionaryType(instance)->Freeze(instance, true);
    }